

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatTest_ConstructU8StringViewFromDataAndSize_Test::
~FormatTest_ConstructU8StringViewFromDataAndSize_Test
          (FormatTest_ConstructU8StringViewFromDataAndSize_Test *this)

{
  void *in_RDI;
  
  ~FormatTest_ConstructU8StringViewFromDataAndSize_Test
            ((FormatTest_ConstructU8StringViewFromDataAndSize_Test *)0x1a0818);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(FormatTest, ConstructU8StringViewFromDataAndSize) {
  fmt::u8string_view s("foobar", 3);
  EXPECT_EQ(s.size(), 3u);
  const fmt::char8_t *data = s.data();
  EXPECT_EQ(data[0], 'f');
  EXPECT_EQ(data[1], 'o');
  EXPECT_EQ(data[2], 'o');
}